

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O2

longdouble * __thiscall
mp::QuadTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (longdouble *__return_storage_ptr__,QuadTerms *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)(__return_storage_ptr__ + 1);
  do {
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  return (longdouble *)0xffffffff00000000;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    long double s=0.0;
    for (size_t i=size(); i--; )
      s += ((long double)(coef(i))) * x[var1(i)] * x[var2(i)];
    return s;
  }